

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

archive_wstring * archive_wstrncat(archive_wstring *as,wchar_t *p,size_t n)

{
  size_t s;
  size_t sVar1;
  archive_wstring *paVar2;
  size_t s_00;
  
  for (sVar1 = 0; (s_00 = n, n != sVar1 && (s_00 = sVar1, p[sVar1] != L'\0')); sVar1 = sVar1 + 1) {
  }
  paVar2 = archive_wstring_append(as,p,s_00);
  if (paVar2 == (archive_wstring *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  return paVar2;
}

Assistant:

struct archive_wstring *
archive_wstrncat(struct archive_wstring *as, const wchar_t *p, size_t n)
{
	size_t s;
	const wchar_t *pp;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	if ((as = archive_wstring_append(as, p, s)) == NULL)
		__archive_errx(1, "Out of memory");
	return (as);
}